

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

void Abc_NtkTimeSetDefaultRequired(Abc_Ntk_t *pNtk,float Rise,float Fall)

{
  Abc_ManTime_t *pAVar1;
  Abc_Obj_t *pAVar2;
  int i;
  
  pAVar1 = pNtk->pManTime;
  if (pAVar1 == (Abc_ManTime_t *)0x0) {
    pAVar1 = Abc_ManTimeStart(pNtk);
    pNtk->pManTime = pAVar1;
  }
  (pAVar1->tReqDef).Rise = Rise;
  (pAVar1->tReqDef).Fall = Fall;
  for (i = 0; i < pNtk->vCos->nSize; i = i + 1) {
    pAVar2 = Abc_NtkCo(pNtk,i);
    Abc_NtkTimeSetRequired(pNtk,pAVar2->Id,Rise,Fall);
  }
  return;
}

Assistant:

void Abc_NtkTimeSetDefaultRequired( Abc_Ntk_t * pNtk, float Rise, float Fall )
{
    Abc_Obj_t * pObj; int i;
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    pNtk->pManTime->tReqDef.Rise  = Rise;
    pNtk->pManTime->tReqDef.Fall  = Fall;
    // set the required times for each output
    Abc_NtkForEachCo( pNtk, pObj, i )
        Abc_NtkTimeSetRequired( pNtk, Abc_ObjId(pObj), Rise, Fall );        
}